

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTS_sstream.c
# Opt level: O3

void HTS_SStreamSet_clear(HTS_SStreamSet *sss)

{
  HTS_SStream *pHVar1;
  ulong uVar2;
  ulong uVar3;
  
  pHVar1 = sss->sstream;
  if (pHVar1 != (HTS_SStream *)0x0) {
    if (sss->nstream != 0) {
      uVar3 = 0;
      do {
        pHVar1 = sss->sstream;
        if (sss->total_state != 0) {
          uVar2 = 0;
          do {
            HTS_free(pHVar1[uVar3].mean[uVar2]);
            HTS_free(pHVar1[uVar3].vari[uVar2]);
            uVar2 = uVar2 + 1;
          } while (uVar2 < sss->total_state);
        }
        if (pHVar1[uVar3].msd != (double *)0x0) {
          HTS_free(pHVar1[uVar3].msd);
        }
        HTS_free(pHVar1[uVar3].mean);
        HTS_free(pHVar1[uVar3].vari);
        if (pHVar1[uVar3].win_size != 0) {
          uVar2 = 0;
          do {
            pHVar1[uVar3].win_coefficient[uVar2] =
                 pHVar1[uVar3].win_coefficient[uVar2] + pHVar1[uVar3].win_l_width[uVar2];
            HTS_free(pHVar1[uVar3].win_coefficient[uVar2]);
            uVar2 = uVar2 + 1;
          } while (uVar2 < pHVar1[uVar3].win_size);
        }
        HTS_free(pHVar1[uVar3].win_coefficient);
        HTS_free(pHVar1[uVar3].win_l_width);
        HTS_free(pHVar1[uVar3].win_r_width);
        if (pHVar1[uVar3].gv_mean != (double *)0x0) {
          HTS_free(pHVar1[uVar3].gv_mean);
        }
        if (pHVar1[uVar3].gv_vari != (double *)0x0) {
          HTS_free(pHVar1[uVar3].gv_vari);
        }
        if (pHVar1[uVar3].gv_switch != (HTS_Boolean *)0x0) {
          HTS_free(pHVar1[uVar3].gv_switch);
        }
        uVar3 = uVar3 + 1;
      } while (uVar3 < sss->nstream);
      pHVar1 = sss->sstream;
    }
    HTS_free(pHVar1);
  }
  if (sss->duration != (size_t *)0x0) {
    HTS_free(sss->duration);
  }
  sss->total_state = 0;
  sss->total_frame = 0;
  sss->nstate = 0;
  sss->duration = (size_t *)0x0;
  sss->sstream = (HTS_SStream *)0x0;
  sss->nstream = 0;
  return;
}

Assistant:

void HTS_SStreamSet_clear(HTS_SStreamSet * sss)
{
   size_t i, j;
   HTS_SStream *sst;

   if (sss->sstream) {
      for (i = 0; i < sss->nstream; i++) {
         sst = &sss->sstream[i];
         for (j = 0; j < sss->total_state; j++) {
            HTS_free(sst->mean[j]);
            HTS_free(sst->vari[j]);
         }
         if (sst->msd)
            HTS_free(sst->msd);
         HTS_free(sst->mean);
         HTS_free(sst->vari);
         for (j = 0; j < sst->win_size; j++) {
            sst->win_coefficient[j] += sst->win_l_width[j];
            HTS_free(sst->win_coefficient[j]);
         }
         HTS_free(sst->win_coefficient);
         HTS_free(sst->win_l_width);
         HTS_free(sst->win_r_width);
         if (sst->gv_mean)
            HTS_free(sst->gv_mean);
         if (sst->gv_vari)
            HTS_free(sst->gv_vari);
         if (sst->gv_switch)
            HTS_free(sst->gv_switch);
      }
      HTS_free(sss->sstream);
   }
   if (sss->duration)
      HTS_free(sss->duration);

   HTS_SStreamSet_initialize(sss);
}